

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::updateArea(btSoftBody *this,bool averageArea)

{
  btScalar bVar1;
  Face *pFVar2;
  long lVar3;
  Node *pNVar4;
  Node *pNVar5;
  undefined1 auVar6 [16];
  long lVar7;
  int *__s;
  btScalar *pbVar8;
  ulong uVar9;
  Node **ppNVar10;
  long lVar11;
  int j;
  long lVar12;
  long lVar13;
  uint uVar14;
  size_t size;
  float fVar15;
  uint uVar16;
  int iVar19;
  int iVar20;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  int iVar31;
  int iVar32;
  btAlignedObjectArray<int> counts;
  btAlignedObjectArray<int> local_40;
  
  iVar20 = (this->m_faces).m_size;
  lVar7 = (long)iVar20;
  if (0 < lVar7) {
    pFVar2 = (this->m_faces).m_data;
    lVar11 = 0;
    do {
      lVar13 = *(long *)((long)pFVar2->m_n + lVar11);
      lVar12 = *(long *)((long)pFVar2->m_n + lVar11 + 8);
      lVar3 = *(long *)((long)pFVar2->m_n + lVar11 + 0x10);
      fVar15 = *(float *)(lVar12 + 0x10) - *(float *)(lVar13 + 0x10);
      fVar25 = *(float *)(lVar12 + 0x14) - *(float *)(lVar13 + 0x14);
      fVar21 = *(float *)(lVar12 + 0x18) - *(float *)(lVar13 + 0x18);
      fVar30 = *(float *)(lVar3 + 0x10) - *(float *)(lVar13 + 0x10);
      fVar22 = *(float *)(lVar3 + 0x14) - *(float *)(lVar13 + 0x14);
      fVar27 = *(float *)(lVar3 + 0x18) - *(float *)(lVar13 + 0x18);
      fVar26 = fVar25 * fVar27 - fVar22 * fVar21;
      fVar21 = fVar21 * fVar30 - fVar27 * fVar15;
      fVar15 = fVar22 * fVar15 - fVar30 * fVar25;
      *(float *)((long)(&pFVar2->m_normal + 1) + lVar11) =
           SQRT(fVar15 * fVar15 + fVar26 * fVar26 + fVar21 * fVar21);
      lVar11 = lVar11 + 0x48;
    } while (lVar7 * 0x48 != lVar11);
  }
  auVar6 = _DAT_001ee270;
  if (!averageArea) {
    iVar32 = (this->m_nodes).m_size;
    lVar11 = (long)iVar32;
    if (0 < lVar11) {
      pNVar4 = (this->m_nodes).m_data;
      lVar13 = lVar11 + -1;
      auVar17._8_4_ = (int)lVar13;
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = 0;
      auVar17 = auVar17 ^ _DAT_001ee270;
      auVar29 = _DAT_001ee5c0;
      auVar23 = _DAT_001ee5d0;
      do {
        auVar28 = auVar23 ^ auVar6;
        iVar19 = auVar17._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar19 && auVar17._0_4_ < auVar28._0_4_ ||
                    iVar19 < auVar28._4_4_) & 1)) {
          *(undefined4 *)((long)(&pNVar4->m_n + 1) + lVar13 + 4) = 0;
        }
        if ((auVar28._12_4_ != auVar17._12_4_ || auVar28._8_4_ <= auVar17._8_4_) &&
            auVar28._12_4_ <= auVar17._12_4_) {
          *(undefined4 *)((long)(&pNVar4[1].m_n + 1) + lVar13 + 4) = 0;
        }
        auVar28 = auVar29 ^ auVar6;
        iVar31 = auVar28._4_4_;
        if (iVar31 <= iVar19 && (iVar31 != iVar19 || auVar28._0_4_ <= auVar17._0_4_)) {
          *(undefined4 *)((long)(&pNVar4[2].m_n + 1) + lVar13 + 4) = 0;
          *(undefined4 *)((long)(&pNVar4[3].m_n + 1) + lVar13 + 4) = 0;
        }
        lVar12 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 4;
        auVar23._8_8_ = lVar12 + 4;
        lVar12 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar12 + 4;
        lVar13 = lVar13 + 0x1e0;
      } while ((ulong)(iVar32 + 3U >> 2) * 0x1e0 - lVar13 != 0);
    }
    if (0 < iVar20) {
      pFVar2 = (this->m_faces).m_data;
      ppNVar10 = pFVar2->m_n;
      lVar13 = 0;
      do {
        fVar15 = pFVar2[lVar13].m_ra;
        lVar12 = 0;
        do {
          ppNVar10[lVar12]->m_area = ppNVar10[lVar12]->m_area + fVar15;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar13 = lVar13 + 1;
        ppNVar10 = ppNVar10 + 9;
      } while (lVar13 != lVar7);
    }
    if (iVar32 < 1) {
      return;
    }
    pNVar4 = (this->m_nodes).m_data;
    lVar7 = 0;
    do {
      *(float *)((long)(&pNVar4->m_n + 1) + lVar7 + 4) =
           *(float *)((long)(&pNVar4->m_n + 1) + lVar7 + 4) * 0.3333333;
      lVar7 = lVar7 + 0x78;
    } while (lVar11 * 0x78 - lVar7 != 0);
    return;
  }
  local_40.m_ownsMemory = true;
  local_40.m_data = (int *)0x0;
  local_40.m_size = 0;
  local_40.m_capacity = 0;
  uVar16 = (this->m_nodes).m_size;
  if ((long)(int)uVar16 < 1) {
    local_40.m_capacity = 0;
    local_40.m_size = uVar16;
    __s = (int *)0x0;
    uVar14 = uVar16;
    goto LAB_001de8d5;
  }
  size = (long)(int)uVar16 << 2;
  __s = (int *)btAlignedAllocInternal(size,0x10);
  if ((long)local_40.m_size < 1) {
    if (local_40.m_data != (int *)0x0) goto LAB_001de77f;
  }
  else {
    lVar7 = 0;
    do {
      __s[lVar7] = local_40.m_data[lVar7];
      lVar7 = lVar7 + 1;
    } while (local_40.m_size != lVar7);
LAB_001de77f:
    if (local_40.m_ownsMemory == true) {
      btAlignedFreeInternal(local_40.m_data);
    }
  }
  local_40.m_ownsMemory = true;
  local_40.m_data = __s;
  local_40.m_capacity = uVar16;
  memset(__s,0,size);
  auVar6 = _DAT_001ee270;
  uVar14 = (this->m_nodes).m_size;
  local_40.m_size = uVar16;
  if (0 < (long)(int)uVar14) {
    pNVar4 = (this->m_nodes).m_data;
    lVar7 = (long)(int)uVar14 + -1;
    auVar18._8_4_ = (int)lVar7;
    auVar18._0_8_ = lVar7;
    auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar18 = auVar18 ^ _DAT_001ee270;
    auVar28 = _DAT_001ee5c0;
    auVar24 = _DAT_001ee5d0;
    do {
      auVar29 = auVar24 ^ auVar6;
      iVar20 = auVar18._4_4_;
      if ((bool)(~(auVar29._4_4_ == iVar20 && auVar18._0_4_ < auVar29._0_4_ ||
                  iVar20 < auVar29._4_4_) & 1)) {
        *(undefined4 *)((long)(&pNVar4->m_n + 1) + lVar7 + 4) = 0;
      }
      if ((auVar29._12_4_ != auVar18._12_4_ || auVar29._8_4_ <= auVar18._8_4_) &&
          auVar29._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)(&pNVar4[1].m_n + 1) + lVar7 + 4) = 0;
      }
      auVar29 = auVar28 ^ auVar6;
      iVar32 = auVar29._4_4_;
      if (iVar32 <= iVar20 && (iVar32 != iVar20 || auVar29._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)(&pNVar4[2].m_n + 1) + lVar7 + 4) = 0;
        *(undefined4 *)((long)(&pNVar4[3].m_n + 1) + lVar7 + 4) = 0;
      }
      lVar11 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar11 + 4;
      lVar11 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar11 + 4;
      lVar7 = lVar7 + 0x1e0;
    } while ((ulong)(uVar14 + 3 >> 2) * 0x1e0 - lVar7 != 0);
  }
LAB_001de8d5:
  lVar7 = (long)(this->m_faces).m_size;
  if (0 < lVar7) {
    pNVar4 = (this->m_nodes).m_data;
    pFVar2 = (this->m_faces).m_data;
    ppNVar10 = pFVar2->m_n;
    lVar11 = 0;
    uVar16 = (uint)DAT_001ee3c0;
    do {
      bVar1 = pFVar2[lVar11].m_ra;
      lVar13 = 0;
      do {
        pNVar5 = ppNVar10[lVar13];
        __s[(int)((ulong)((long)pNVar5 - (long)pNVar4) >> 3) * -0x11111111] =
             __s[(int)((ulong)((long)pNVar5 - (long)pNVar4) >> 3) * -0x11111111] + 1;
        pNVar5->m_area = pNVar5->m_area + (float)((uint)bVar1 & uVar16);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar11 = lVar11 + 1;
      ppNVar10 = ppNVar10 + 9;
    } while (lVar11 != lVar7);
    uVar14 = (this->m_nodes).m_size;
  }
  if (0 < (int)uVar14) {
    pbVar8 = &((this->m_nodes).m_data)->m_area;
    uVar9 = 0;
    do {
      if (__s[uVar9] < 1) {
        *pbVar8 = 0.0;
      }
      else {
        *pbVar8 = *pbVar8 / (float)__s[uVar9];
      }
      uVar9 = uVar9 + 1;
      pbVar8 = pbVar8 + 0x1e;
    } while (uVar14 != uVar9);
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_40);
  return;
}

Assistant:

void				btSoftBody::updateArea(bool averageArea)
{
	int i,ni;

	/* Face area		*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		Face&		f=m_faces[i];
		f.m_ra	=	AreaOf(f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x);
	}
	
	/* Node area		*/ 

	if (averageArea)
	{
		btAlignedObjectArray<int>	counts;
		counts.resize(m_nodes.size(),0);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area	=	0;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];
			for(int j=0;j<3;++j)
			{
				const int index=(int)(f.m_n[j]-&m_nodes[0]);
				counts[index]++;
				f.m_n[j]->m_area+=btFabs(f.m_ra);
			}
		}
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			if(counts[i]>0)
				m_nodes[i].m_area/=(btScalar)counts[i];
			else
				m_nodes[i].m_area=0;
		}
	}
	else
	{
		// initialize node area as zero
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area=0;	
		}

		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];

			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_area += f.m_ra;
			}
		}

		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area *= 0.3333333f;
		}
	}
}